

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

bool FIX::Message::isHeaderField(int field)

{
  bool local_9;
  int field_local;
  
  if (((((((field - 8U < 2) || (field - 0x22U < 2)) || (field == 0x2b)) ||
        ((field - 0x31U < 2 || (field == 0x34)))) ||
       ((field - 0x38U < 2 || ((field == 0x5a || (field == 0x61)))))) || (field - 0x73U < 2)) ||
     ((((field == 0x7a || (field - 0x80U < 2)) || (field - 0x8eU < 4)) ||
      (((field - 0xd4U < 2 || (field == 0x15b)) ||
       ((field - 0x171U < 2 || ((field == 0x273 || (field == 0x468 || field == 0x469)))))))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool Message::isHeaderField( int field )
{
  switch ( field )
  {
    case FIELD::BeginString:
    case FIELD::BodyLength:
    case FIELD::MsgType:
    case FIELD::SenderCompID:
    case FIELD::TargetCompID:
    case FIELD::OnBehalfOfCompID:
    case FIELD::DeliverToCompID:
    case FIELD::SecureDataLen:
    case FIELD::MsgSeqNum:
    case FIELD::SenderSubID:
    case FIELD::SenderLocationID:
    case FIELD::TargetSubID:
    case FIELD::TargetLocationID:
    case FIELD::OnBehalfOfSubID:
    case FIELD::OnBehalfOfLocationID:
    case FIELD::DeliverToSubID:
    case FIELD::DeliverToLocationID:
    case FIELD::PossDupFlag:
    case FIELD::PossResend:
    case FIELD::SendingTime:
    case FIELD::OrigSendingTime:
    case FIELD::XmlDataLen:
    case FIELD::XmlData:
    case FIELD::MessageEncoding:
    case FIELD::LastMsgSeqNumProcessed:
    case FIELD::OnBehalfOfSendingTime:
    case FIELD::ApplVerID:
    case FIELD::CstmApplVerID:
    case FIELD::NoHops:
    return true;
    default:
    return false;
  };
}